

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cpp
# Opt level: O0

string * __thiscall
spvtools::ExtensionSetToString_abi_cxx11_
          (string *__return_storage_ptr__,spvtools *this,ExtensionSet *extensions)

{
  EnumSet<spvtools::Extension> *this_00;
  bool bVar1;
  Extension extension_00;
  char *pcVar2;
  ostream *poVar3;
  undefined1 local_1d8 [4];
  Extension extension;
  iterator __end1;
  iterator __begin1;
  ExtensionSet *__range1;
  stringstream ss;
  ostream aoStack_190 [376];
  EnumSet<spvtools::Extension> *local_18;
  ExtensionSet *extensions_local;
  
  local_18 = (EnumSet<spvtools::Extension> *)this;
  extensions_local = (ExtensionSet *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&__range1);
  this_00 = local_18;
  EnumSet<spvtools::Extension>::begin((iterator *)&__end1.bucketOffset_,local_18);
  EnumSet<spvtools::Extension>::end((iterator *)local_1d8,this_00);
  while( true ) {
    bVar1 = EnumSet<spvtools::Extension>::Iterator::operator!=
                      ((Iterator *)&__end1.bucketOffset_,(Iterator *)local_1d8);
    if (!bVar1) break;
    extension_00 = EnumSet<spvtools::Extension>::Iterator::operator*
                             ((Iterator *)&__end1.bucketOffset_);
    pcVar2 = ExtensionToString(extension_00);
    poVar3 = std::operator<<(aoStack_190,pcVar2);
    std::operator<<(poVar3," ");
    EnumSet<spvtools::Extension>::Iterator::operator++((Iterator *)&__end1.bucketOffset_);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string ExtensionSetToString(const ExtensionSet& extensions) {
  std::stringstream ss;
  for (auto extension : extensions) {
    ss << ExtensionToString(extension) << " ";
  }
  return ss.str();
}